

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O3

SHADER_TYPE Diligent::GLShaderBitsToShaderTypes(GLenum ShaderBits)

{
  SHADER_TYPE SVar1;
  uint uVar2;
  bool bVar3;
  
  SVar1 = SHADER_TYPE_UNKNOWN;
  if (ShaderBits != 0) {
    do {
      uVar2 = -ShaderBits & ShaderBits;
      switch(uVar2) {
      case 1:
        SVar1 = SVar1 | SHADER_TYPE_VERTEX;
        break;
      case 2:
        SVar1 = SVar1 | SHADER_TYPE_PIXEL;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        SVar1 = SVar1 | SHADER_TYPE_GEOMETRY;
        break;
      case 8:
        SVar1 = SVar1 | SHADER_TYPE_HULL;
        break;
      default:
        if (uVar2 == 0x10) {
          SVar1 = SVar1 | SHADER_TYPE_DOMAIN;
        }
        else if (uVar2 == 0x20) {
          SVar1 = SVar1 | SHADER_TYPE_COMPUTE;
        }
      }
      bVar3 = uVar2 != ShaderBits;
      ShaderBits = uVar2 ^ ShaderBits;
    } while (bVar3);
  }
  return SVar1;
}

Assistant:

SHADER_TYPE GLShaderBitsToShaderTypes(GLenum ShaderBits)
{
    SHADER_TYPE Result = SHADER_TYPE_UNKNOWN;
    while (ShaderBits != 0)
    {
        auto Type = ExtractLSB(ShaderBits);
        switch (Type)
        {
            // clang-format off
            case GL_VERTEX_SHADER_BIT:          Result |= SHADER_TYPE_VERTEX;   break;
            case GL_FRAGMENT_SHADER_BIT:        Result |= SHADER_TYPE_PIXEL;    break;
            case GL_GEOMETRY_SHADER_BIT:        Result |= SHADER_TYPE_GEOMETRY; break;
            case GL_TESS_CONTROL_SHADER_BIT:    Result |= SHADER_TYPE_HULL;     break;
            case GL_TESS_EVALUATION_SHADER_BIT: Result |= SHADER_TYPE_DOMAIN;   break;
            case GL_COMPUTE_SHADER_BIT:         Result |= SHADER_TYPE_COMPUTE;  break;
                // clang-format on
        }
    }
    return Result;
}